

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderLineSegments<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLogLog>
               (GetterXsYs<unsigned_long_long> *getter1,GetterXsYRef<unsigned_long_long> *getter2,
               TransformerLogLog *transformer,ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  ImPlotPlot *pIVar10;
  double dVar11;
  double dVar12;
  ImPlotContext *pIVar13;
  ImPlotContext *pIVar14;
  long lVar15;
  int iVar16;
  float fVar17;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_90;
  int local_84;
  ImDrawList *local_80;
  double local_78;
  double dStack_70;
  ImPlotContext *local_60;
  undefined1 local_58 [8];
  GetterXsYRef<unsigned_long_long> *local_50;
  TransformerLogLog *local_48;
  int local_40;
  ImU32 local_3c;
  float local_38;
  
  local_80 = DrawList;
  if (((GImPlot->CurrentPlot->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true))
  {
    local_40 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_40 = getter1->Count;
    }
    local_58 = (undefined1  [8])getter1;
    local_50 = getter2;
    local_48 = transformer;
    local_3c = col;
    local_38 = line_weight;
    RenderPrimitives<ImPlot::LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::GetterXsYRef<unsigned_long_long>,ImPlot::TransformerLogLog>>
              ((LineSegmentsRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
                *)local_58,DrawList,&GImPlot->CurrentPlot->PlotRect);
  }
  else {
    local_60 = GImPlot;
    local_84 = getter2->Count;
    if (getter1->Count < getter2->Count) {
      local_84 = getter1->Count;
    }
    if (0 < local_84) {
      iVar16 = 0;
      do {
        pIVar13 = GImPlot;
        iVar9 = getter1->Count;
        lVar15 = (long)(((getter1->Offset + iVar16) % iVar9 + iVar9) % iVar9) *
                 (long)getter1->Stride;
        uVar3 = *(unsigned_long_long *)((long)getter1->Xs + lVar15);
        uVar4 = *(unsigned_long_long *)((long)getter1->Ys + lVar15);
        dStack_70 = (double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25;
        local_78 = dStack_70 + ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
        dVar11 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25)
                       + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar5 = pIVar13->LogDenX;
        pIVar10 = pIVar13->CurrentPlot;
        dVar6 = (pIVar10->XAxis).Range.Min;
        dVar7 = (pIVar10->XAxis).Range.Max;
        dVar12 = log10(local_78 / pIVar10->YAxis[transformer->YAxis].Range.Min);
        pIVar14 = GImPlot;
        iVar9 = transformer->YAxis;
        pIVar10 = pIVar13->CurrentPlot;
        dVar8 = pIVar10->YAxis[iVar9].Range.Min;
        local_58._0_4_ =
             (undefined4)
             ((((double)(float)(dVar11 / dVar5) * (dVar7 - dVar6) + dVar6) -
              (pIVar10->XAxis).Range.Min) * pIVar13->Mx + (double)pIVar13->PixelRange[iVar9].Min.x);
        local_58._4_4_ =
             (float)((((double)(float)(dVar12 / pIVar13->LogDenY[iVar9]) *
                       (pIVar10->YAxis[iVar9].Range.Max - dVar8) + dVar8) - dVar8) *
                     pIVar13->My[iVar9] + (double)pIVar13->PixelRange[iVar9].Min.y);
        iVar9 = getter2->Count;
        uVar3 = *(unsigned_long_long *)
                 ((long)getter2->Xs +
                 (long)(((getter2->Offset + iVar16) % iVar9 + iVar9) % iVar9) *
                 (long)getter2->Stride);
        local_78 = getter2->YRef;
        dVar11 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25)
                       + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar5 = pIVar14->LogDenX;
        pIVar10 = pIVar14->CurrentPlot;
        dVar6 = (pIVar10->XAxis).Range.Min;
        dVar7 = (pIVar10->XAxis).Range.Max;
        dVar12 = log10(local_78 / pIVar10->YAxis[transformer->YAxis].Range.Min);
        iVar9 = transformer->YAxis;
        pIVar10 = pIVar14->CurrentPlot;
        dVar8 = pIVar10->YAxis[iVar9].Range.Min;
        local_90.x = (float)((((double)(float)(dVar11 / dVar5) * (dVar7 - dVar6) + dVar6) -
                             (pIVar10->XAxis).Range.Min) * pIVar14->Mx +
                            (double)pIVar14->PixelRange[iVar9].Min.x);
        fVar17 = (float)((((double)(float)(dVar12 / pIVar14->LogDenY[iVar9]) *
                           (pIVar10->YAxis[iVar9].Range.Max - dVar8) + dVar8) - dVar8) *
                         pIVar14->My[iVar9] + (double)pIVar14->PixelRange[iVar9].Min.y);
        local_90.y = fVar17;
        pIVar10 = local_60->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar17 <= (float)local_58._4_4_) {
          fVar2 = fVar17;
        }
        if ((fVar2 < (pIVar10->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar17 <= (float)local_58._4_4_) & (uint)fVar17 |
                           local_58._4_4_ & -(uint)(fVar17 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar10->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_90.x <= (float)local_58._0_4_) {
            fVar2 = local_90.x;
          }
          if ((fVar2 < (pIVar10->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_90.x <= (float)local_58._0_4_) & (uint)local_90.x |
                             local_58._0_4_ & -(uint)(local_90.x <= (float)local_58._0_4_)),
             (pIVar10->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar10->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_80,(ImVec2 *)local_58,&local_90,col,line_weight);
          }
        }
        iVar16 = iVar16 + 1;
      } while (local_84 != iVar16);
    }
  }
  return;
}

Assistant:

inline void RenderLineSegments(const Getter1& getter1, const Getter2& getter2, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        int I = ImMin(getter1.Count, getter2.Count);
        for (int i = 0; i < I; ++i) {
            ImVec2 p1 = transformer(getter1(i));
            ImVec2 p2 = transformer(getter2(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
        }
    }
    else {
        RenderPrimitives(LineSegmentsRenderer<Getter1,Getter2,Transformer>(getter1, getter2, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}